

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

void __thiscall sf::priv::GlxContext::updateSettingsFromWindow(GlxContext *this)

{
  int iVar1;
  XVisualInfo *visualInfo;
  ostream *poVar2;
  int nbVisuals;
  XVisualInfo tpl;
  XWindowAttributes windowAttributes;
  
  iVar1 = XGetWindowAttributes(this->m_display,this->m_window,&windowAttributes);
  if (iVar1 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to get the window attributes");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    tpl.screen = *(int *)(this->m_display + 0xe0);
    tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
    visualInfo = (XVisualInfo *)XGetVisualInfo(this->m_display,3,&tpl);
    if (visualInfo != (XVisualInfo *)0x0) {
      updateSettingsFromVisualInfo(this,visualInfo);
      XFree(visualInfo);
    }
  }
  return;
}

Assistant:

void GlxContext::updateSettingsFromWindow()
{
    // Retrieve the attributes of the target window
    XWindowAttributes windowAttributes;
    if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
    {
        err() << "Failed to get the window attributes" << std::endl;
        return;
    }

    // Get its visuals
    XVisualInfo tpl;
    tpl.screen   = DefaultScreen(m_display);
    tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
    int nbVisuals = 0;
    XVisualInfo* visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);

    if (!visualInfo)
        return;

    updateSettingsFromVisualInfo(visualInfo);

    XFree(visualInfo);
}